

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rules.cpp
# Opt level: O1

ShaderReplacementRule *
polyscope::render::backend_openGL3_glfw::generateSlicePlaneRule
          (ShaderReplacementRule *__return_storage_ptr__,string *uniquePostfix)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<polyscope::render::ShaderSpecUniform> __l_00;
  string normalUniformName;
  string centerUniformName;
  allocator_type local_30a;
  allocator_type local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  long lStack_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  local_1c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  local_198;
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  ShaderSpecUniform local_100;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined4 local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  std::operator+(&local_208,"u_slicePlaneCenter_",uniquePostfix);
  std::operator+(&local_308,"u_slicePlaneNormal_",uniquePostfix);
  std::operator+(&local_120,"SLICE_PLANE_CULL_",uniquePostfix);
  std::operator+(&local_140,"uniform vec3 ",&local_208);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_140);
  local_268 = &local_258;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_258 = *plVar2;
    lStack_250 = plVar1[3];
  }
  else {
    local_258 = *plVar2;
    local_268 = (long *)*plVar1;
  }
  local_260 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_268,(ulong)local_308._M_dataplus._M_p);
  local_248 = &local_238;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_238 = *plVar2;
    lStack_230 = plVar1[3];
  }
  else {
    local_238 = *plVar2;
    local_248 = (long *)*plVar1;
  }
  local_240 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_228.field_2._M_allocated_capacity = *psVar3;
    local_228.field_2._8_8_ = plVar1[3];
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar3;
    local_228._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_228._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[18],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_b0,(char (*) [18])"FRAG_DECLARATIONS",&local_228);
  std::operator+(&local_160,"if(dot(cullPos, ",&local_308);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_2e8 = &local_2d8;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_2d8 = *plVar2;
    lStack_2d0 = plVar1[3];
  }
  else {
    local_2d8 = *plVar2;
    local_2e8 = (long *)*plVar1;
  }
  local_2e0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2e8,(ulong)local_208._M_dataplus._M_p);
  local_2c8 = &local_2b8;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_2b8 = *plVar2;
    lStack_2b0 = plVar1[3];
  }
  else {
    local_2b8 = *plVar2;
    local_2c8 = (long *)*plVar1;
  }
  local_2c0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  local_2a8 = &local_298;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_298 = *plVar2;
    lStack_290 = plVar1[3];
  }
  else {
    local_298 = *plVar2;
    local_2a8 = (long *)*plVar1;
  }
  local_2a0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2a8,(ulong)local_308._M_dataplus._M_p);
  local_288 = &local_278;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_278 = *plVar2;
    lStack_270 = plVar1[3];
  }
  else {
    local_278 = *plVar2;
    local_288 = (long *)*plVar1;
  }
  local_280 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_288);
  psVar3 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_1e8.field_2._M_allocated_capacity = *psVar3;
    local_1e8.field_2._8_8_ = plVar1[3];
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *psVar3;
    local_1e8._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_1e8._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[23],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_70,(char (*) [23])"GLOBAL_FRAGMENT_FILTER",&local_1e8);
  __l._M_len = 2;
  __l._M_array = &local_b0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_1b0,__l,&local_309);
  local_100.name._M_dataplus._M_p = (pointer)&local_100.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  local_100.type = Vector3Float;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,local_308._M_dataplus._M_p,
             local_308._M_dataplus._M_p + local_308._M_string_length);
  local_b8 = 1;
  __l_00._M_len = 2;
  __l_00._M_array = &local_100;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector(&local_1c8,__l_00,&local_30a);
  local_178.
  super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShaderReplacementRule::ShaderReplacementRule
            (__return_storage_ptr__,&local_120,&local_1b0,&local_1c8,&local_178,&local_198);
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector(&local_198);
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector(&local_178);
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_1c8);
  lVar4 = 0;
  do {
    if (local_c8 + lVar4 != *(undefined1 **)((long)local_d8 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_d8 + lVar4));
    }
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x50);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1b0);
  lVar4 = -0x80;
  paVar5 = &local_70.second.field_2;
  do {
    if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*(undefined1 **)(paVar5->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar5->_M_local_buf + -0x10));
    }
    if (paVar5->_M_local_buf + -0x20 != *(char **)(paVar5->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar5->_M_local_buf + -0x30));
    }
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(paVar5->_M_local_buf + -0x40);
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderReplacementRule generateSlicePlaneRule(std::string uniquePostfix) {

  std::string centerUniformName = "u_slicePlaneCenter_" + uniquePostfix;
  std::string normalUniformName = "u_slicePlaneNormal_" + uniquePostfix;

  // This takes what is otherwise a simple rule, and substitues uniquely named uniforms so that we can have multiple slice planes
  ShaderReplacementRule slicePlaneRule (
      /* rule name */ "SLICE_PLANE_CULL_" + uniquePostfix,
      { /* replacement sources */
        {"FRAG_DECLARATIONS", "uniform vec3 " + centerUniformName + "; uniform vec3 " + normalUniformName + ";"},
        {"GLOBAL_FRAGMENT_FILTER", 
         "if(dot(cullPos, " + normalUniformName + ") < dot( " + centerUniformName + " , " + normalUniformName + ")) { discard; }"}
      },
      /* uniforms */ {
        {centerUniformName, DataType::Vector3Float},
        {normalUniformName, DataType::Vector3Float},
      },
      /* attributes */ {},
      /* textures */ {}
  );

  return slicePlaneRule;
}